

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.c
# Opt level: O2

int uv_spawn(uv_loop_t *loop,uv_process_t *process,uv_process_options_t *options)

{
  uint *puVar1;
  uint uVar2;
  uv_stdio_container_t *puVar3;
  long lVar4;
  int iVar5;
  __pid_t __pid;
  int iVar6;
  __pid_t _Var7;
  int (*pipes) [2];
  ulong uVar8;
  long *plVar9;
  int *piVar10;
  ssize_t sVar11;
  uint stdio_count;
  long lVar12;
  ulong uVar13;
  int (*fds) [2];
  long lVar14;
  int signal_pipe [2];
  int local_190;
  int status;
  uv_process_t *local_188;
  void **local_180;
  int pipes_storage [8] [2];
  __sigset_t local_130;
  sigset_t signewset;
  
  if ((options->cpumask != (char *)0x0) &&
     (uVar13 = options->cpumask_size, iVar5 = uv_cpumask_size(), uVar13 < (ulong)(long)iVar5)) {
    return -0x16;
  }
  if (options->file == (char *)0x0) {
    __assert_fail("options->file != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmlibuv/src/unix/process.c"
                  ,0x3f3,"int uv_spawn(uv_loop_t *, uv_process_t *, const uv_process_options_t *)");
  }
  if (0xff < options->flags) {
    __assert_fail("!(options->flags & ~(UV_PROCESS_DETACHED | UV_PROCESS_SETGID | UV_PROCESS_SETUID | UV_PROCESS_WINDOWS_FILE_PATH_EXACT_NAME | UV_PROCESS_WINDOWS_HIDE | UV_PROCESS_WINDOWS_HIDE_CONSOLE | UV_PROCESS_WINDOWS_HIDE_GUI | UV_PROCESS_WINDOWS_VERBATIM_ARGUMENTS))"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmlibuv/src/unix/process.c"
                  ,0x3fb,"int uv_spawn(uv_loop_t *, uv_process_t *, const uv_process_options_t *)");
  }
  process->loop = loop;
  process->type = UV_PROCESS;
  process->flags = 8;
  process->handle_queue[0] = loop->handle_queue;
  plVar9 = (long *)loop->handle_queue[1];
  process->handle_queue[1] = plVar9;
  *plVar9 = (long)process->handle_queue;
  loop->handle_queue[1] = process->handle_queue;
  process->next_closing = (uv_handle_t *)0x0;
  local_180 = process->queue;
  process->queue[0] = local_180;
  process->queue[1] = local_180;
  process->status = 0;
  uVar2 = options->stdio_count;
  stdio_count = 3;
  if (3 < (int)uVar2) {
    stdio_count = uVar2;
  }
  uVar13 = (ulong)stdio_count;
  if ((int)uVar2 < 9) {
    pipes = pipes_storage;
  }
  else {
    pipes = (int (*) [2])uv__malloc(uVar13 * 8);
    if (pipes == (int (*) [2])0x0) {
      return -0xc;
    }
  }
  for (uVar8 = 0; uVar13 != uVar8; uVar8 = uVar8 + 1) {
    pipes[uVar8] = (int  [2])0xffffffffffffffff;
  }
  lVar12 = 8;
  fds = pipes;
  local_188 = process;
  for (lVar14 = 0; lVar14 < options->stdio_count; lVar14 = lVar14 + 1) {
    puVar3 = options->stdio;
    uVar2 = *(uint *)((long)puVar3 + lVar12 + -8);
    switch(uVar2 & 7) {
    case 0:
      break;
    case 1:
      lVar4 = *(long *)((long)&puVar3->flags + lVar12);
      if (lVar4 == 0) {
        __assert_fail("container->data.stream != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmlibuv/src/unix/process.c"
                      ,0xc1,"int uv__process_init_stdio(uv_stdio_container_t *, int *)");
      }
      if (*(int *)(lVar4 + 0x10) != 7) {
LAB_00107a94:
        iVar5 = -0x16;
        goto LAB_00107cba;
      }
      iVar5 = uv_socketpair(1,0,*fds,0,0);
      if (iVar5 != 0) goto LAB_00107cba;
      break;
    case 2:
    case 4:
      plVar9 = (long *)((long)&puVar3->flags + lVar12);
      if ((uVar2 & 2) == 0) {
        plVar9 = (long *)(*plVar9 + 0xb8);
      }
      if ((int)*plVar9 == -1) goto LAB_00107a94;
      (*fds)[1] = (int)*plVar9;
      break;
    default:
      __assert_fail("0 && \"Unexpected flags\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmlibuv/src/unix/process.c"
                    ,0xd5,"int uv__process_init_stdio(uv_stdio_container_t *, int *)");
    }
    fds = fds + 1;
    lVar12 = lVar12 + 0x10;
  }
  uv_signal_start(&loop->child_watcher,uv__chld,0x11);
  signal_pipe[0] = -1;
  signal_pipe[1] = -1;
  iVar5 = uv__make_pipe(signal_pipe,0);
  if (iVar5 == 0) {
    uv_rwlock_wrlock(&loop->cloexec_lock);
    iVar5 = signal_pipe[1];
    sigfillset((sigset_t *)&signewset);
    sigdelset((sigset_t *)&signewset,9);
    sigdelset((sigset_t *)&signewset,0x13);
    sigdelset((sigset_t *)&signewset,5);
    sigdelset((sigset_t *)&signewset,0xb);
    sigdelset((sigset_t *)&signewset,7);
    sigdelset((sigset_t *)&signewset,4);
    sigdelset((sigset_t *)&signewset,0x1f);
    sigdelset((sigset_t *)&signewset,6);
    iVar6 = pthread_sigmask(0,(sigset_t *)&signewset,&local_130);
    if (iVar6 != 0) {
LAB_00107dcb:
      abort();
    }
    __pid = fork();
    if (__pid == 0) {
      uv__process_child_init(options,stdio_count,pipes,iVar5);
      goto LAB_00107e5f;
    }
    iVar5 = 0;
    iVar6 = pthread_sigmask(2,&local_130,(__sigset_t *)0x0);
    if (iVar6 != 0) goto LAB_00107dcb;
    if (__pid == -1) {
      piVar10 = __errno_location();
      iVar5 = -*piVar10;
    }
    uv_rwlock_wrunlock(&loop->cloexec_lock);
    uv__close(signal_pipe[1]);
    if (iVar5 == 0) {
      do {
        sVar11 = read(signal_pipe[0],&local_190,4);
        if (sVar11 != -1) {
          if (sVar11 == 0) {
            iVar5 = 0;
            goto LAB_00107b92;
          }
          if (sVar11 != 4) goto LAB_00107dcb;
          goto LAB_00107d92;
        }
        piVar10 = __errno_location();
      } while (*piVar10 == 4);
      if (*piVar10 != 0x20) goto LAB_00107dcb;
      do {
        _Var7 = waitpid(__pid,&status,0);
        if (_Var7 != -1) break;
      } while (*piVar10 == 4);
      if (_Var7 != __pid) {
        __assert_fail("err == *pid",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmlibuv/src/unix/process.c"
                      ,0x3cb,
                      "int uv__spawn_and_init_child(uv_loop_t *, const uv_process_options_t *, int, int (*)[2], pid_t *)"
                     );
      }
      iVar5 = -0x20;
    }
    goto LAB_00107b92;
  }
  goto LAB_00107bf2;
LAB_00107c96:
  for (; iVar5 = iVar6, lVar14 != 0; lVar14 = lVar14 + -0x10) {
    if ((*(byte *)((long)&options->stdio[-1].flags + lVar14) & 1) != 0) {
      uv__stream_close(*(uv_stream_t **)((long)options->stdio + lVar14 + -8));
    }
  }
LAB_00107cba:
  lVar12 = 0;
  for (uVar8 = 0; uVar13 != uVar8; uVar8 = uVar8 + 1) {
    if (((long)options->stdio_count <= (long)uVar8) ||
       ((*(byte *)((long)&options->stdio->flags + lVar12) & 6) == 0)) {
      if (pipes[uVar8][0] != -1) {
        uv__close_nocheckstdio(pipes[uVar8][0]);
      }
      if (pipes[uVar8][1] != -1) {
        uv__close_nocheckstdio(pipes[uVar8][1]);
      }
    }
    lVar12 = lVar12 + 0x10;
  }
  if (pipes == pipes_storage) {
    return iVar5;
  }
  goto LAB_00107d09;
  while (piVar10 = __errno_location(), *piVar10 == 4) {
LAB_00107d92:
    _Var7 = waitpid(__pid,&status,0);
    if (_Var7 != -1) break;
  }
  iVar5 = local_190;
  if (_Var7 != __pid) {
LAB_00107e5f:
    __assert_fail("err == *pid",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmlibuv/src/unix/process.c"
                  ,0x3c4,
                  "int uv__spawn_and_init_child(uv_loop_t *, const uv_process_options_t *, int, int (*)[2], pid_t *)"
                 );
  }
LAB_00107b92:
  uv__close_nocheckstdio(signal_pipe[0]);
  if (iVar5 == 0) {
    local_188->pid = __pid;
    local_188->exit_cb = options->exit_cb;
    local_188->queue[0] = loop->process_handles;
    plVar9 = (long *)loop->process_handles[1];
    local_188->queue[1] = plVar9;
    *plVar9 = (long)local_180;
    loop->process_handles[1] = local_180;
    uVar2 = local_188->flags;
    iVar5 = 0;
    if (((uVar2 & 4) == 0) && (local_188->flags = uVar2 | 4, (uVar2 & 8) != 0)) {
      puVar1 = &local_188->loop->active_handles;
      *puVar1 = *puVar1 + 1;
      iVar5 = 0;
    }
  }
LAB_00107bf2:
  lVar14 = 0;
  for (lVar12 = 0; lVar12 < options->stdio_count; lVar12 = lVar12 + 1) {
    puVar3 = options->stdio;
    if (((*(byte *)((long)&puVar3->flags + lVar14) & 1) != 0) && (-1 < pipes[lVar12][0])) {
      iVar6 = uv__close(pipes[lVar12][1]);
      if (iVar6 != 0) goto LAB_00107dcb;
      pipes[lVar12][1] = -1;
      uv__nonblock_ioctl(pipes[lVar12][0],1);
      uVar2 = *(uint *)((long)&puVar3->flags + lVar14);
      iVar6 = uv__stream_open(*(uv_stream_t **)((long)&puVar3->data + lVar14),pipes[lVar12][0],
                              (uVar2 & 0x10) << 0xb | (uVar2 & 0x20) << 9);
      if (iVar6 != 0) goto LAB_00107c96;
    }
    lVar14 = lVar14 + 0x10;
  }
  if (pipes != pipes_storage) {
LAB_00107d09:
    uv__free(pipes);
  }
  return iVar5;
}

Assistant:

int uv_spawn(uv_loop_t* loop,
             uv_process_t* process,
             const uv_process_options_t* options) {
#if defined(__APPLE__) && (TARGET_OS_TV || TARGET_OS_WATCH)
  /* fork is marked __WATCHOS_PROHIBITED __TVOS_PROHIBITED. */
  return UV_ENOSYS;
#else
  int pipes_storage[8][2];
  int (*pipes)[2];
  int stdio_count;
  pid_t pid;
  int err;
  int exec_errorno;
  int i;

  if (options->cpumask != NULL) {
#ifndef CMAKE_BOOTSTRAP
#if defined(__linux__) || defined(__FreeBSD__)
    if (options->cpumask_size < (size_t)uv_cpumask_size()) {
      return UV_EINVAL;
    }
#else
    return UV_ENOTSUP;
#endif
#else
    return UV_ENOTSUP;
#endif
  }

  assert(options->file != NULL);
  assert(!(options->flags & ~(UV_PROCESS_DETACHED |
                              UV_PROCESS_SETGID |
                              UV_PROCESS_SETUID |
                              UV_PROCESS_WINDOWS_FILE_PATH_EXACT_NAME |
                              UV_PROCESS_WINDOWS_HIDE |
                              UV_PROCESS_WINDOWS_HIDE_CONSOLE |
                              UV_PROCESS_WINDOWS_HIDE_GUI |
                              UV_PROCESS_WINDOWS_VERBATIM_ARGUMENTS)));

  uv__handle_init(loop, (uv_handle_t*)process, UV_PROCESS);
  QUEUE_INIT(&process->queue);
  process->status = 0;

  stdio_count = options->stdio_count;
  if (stdio_count < 3)
    stdio_count = 3;

  err = UV_ENOMEM;
  pipes = pipes_storage;
  if (stdio_count > (int) ARRAY_SIZE(pipes_storage))
    pipes = uv__malloc(stdio_count * sizeof(*pipes));

  if (pipes == NULL)
    goto error;

  for (i = 0; i < stdio_count; i++) {
    pipes[i][0] = -1;
    pipes[i][1] = -1;
  }

  for (i = 0; i < options->stdio_count; i++) {
    err = uv__process_init_stdio(options->stdio + i, pipes[i]);
    if (err)
      goto error;
  }

#ifdef UV_USE_SIGCHLD
  uv_signal_start(&loop->child_watcher, uv__chld, SIGCHLD);
#endif

  /* Spawn the child */
  exec_errorno = uv__spawn_and_init_child(loop, options, stdio_count, pipes, &pid);

#if 0
  /* This runs into a nodejs issue (it expects initialized streams, even if the
   * exec failed).
   * See https://github.com/libuv/libuv/pull/3107#issuecomment-782482608 */
  if (exec_errorno != 0)
      goto error;
#endif

  /* Activate this handle if exec() happened successfully, even if we later
   * fail to open a stdio handle. This ensures we can eventually reap the child
   * with waitpid. */
  if (exec_errorno == 0) {
#ifndef UV_USE_SIGCHLD
    struct kevent event;
    EV_SET(&event, pid, EVFILT_PROC, EV_ADD | EV_ONESHOT, NOTE_EXIT, 0, 0);
    if (kevent(loop->backend_fd, &event, 1, NULL, 0, NULL)) {
      if (errno != ESRCH)
        abort();
      /* Process already exited. Call waitpid on the next loop iteration. */
      process->flags |= UV_HANDLE_REAP;
      loop->flags |= UV_LOOP_REAP_CHILDREN;
    }
#endif

    process->pid = pid;
    process->exit_cb = options->exit_cb;
    QUEUE_INSERT_TAIL(&loop->process_handles, &process->queue);
    uv__handle_start(process);
  }

  for (i = 0; i < options->stdio_count; i++) {
    err = uv__process_open_stream(options->stdio + i, pipes[i]);
    if (err == 0)
      continue;

    while (i--)
      uv__process_close_stream(options->stdio + i);

    goto error;
  }

  if (pipes != pipes_storage)
    uv__free(pipes);

  return exec_errorno;

error:
  if (pipes != NULL) {
    for (i = 0; i < stdio_count; i++) {
      if (i < options->stdio_count)
        if (options->stdio[i].flags & (UV_INHERIT_FD | UV_INHERIT_STREAM))
          continue;
      if (pipes[i][0] != -1)
        uv__close_nocheckstdio(pipes[i][0]);
      if (pipes[i][1] != -1)
        uv__close_nocheckstdio(pipes[i][1]);
    }

    if (pipes != pipes_storage)
      uv__free(pipes);
  }

  return err;
#endif
}